

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

void tcu::astc::anon_unknown_0::bitTransferSigned(deInt32 *a,deInt32 *b)

{
  int iVar1;
  
  iVar1 = *b;
  *b = iVar1 >> 1;
  *b = *a & 0x80U | iVar1 >> 1;
  *a = (*a << 0x19) >> 0x1f & 0xffffffc0U | (uint)*a >> 1 & 0x3f;
  return;
}

Assistant:

inline void bitTransferSigned (deInt32& a, deInt32& b)
{
	b >>= 1;
	b |= a & 0x80;
	a >>= 1;
	a &= 0x3f;
	if (isBitSet(a, 5))
		a -= 0x40;
}